

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<TPZGeoElSide>::ReallocForNuma(TPZVec<TPZGeoElSide> *this)

{
  ulong uVar1;
  TPZGeoElSide *__src;
  undefined1 auVar2 [16];
  ulong __n;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = this->fNElements;
  if ((uVar1 != 0) && (__src = this->fStore, __src != (TPZGeoElSide *)0x0)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    __n = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar5 = __n + 8;
    if (0xfffffffffffffff7 < __n) {
      uVar5 = 0xffffffffffffffff;
    }
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    puVar3 = (ulong *)operator_new__(uVar5);
    *puVar3 = uVar1;
    lVar4 = 0;
    do {
      *(undefined ***)((long)puVar3 + lVar4 + 8) = &PTR__TPZGeoElSide_018f8760;
      *(undefined8 *)((long)puVar3 + lVar4 + 0x10) = 0;
      *(undefined4 *)((long)puVar3 + lVar4 + 0x18) = 0xffffffff;
      lVar4 = lVar4 + 0x18;
    } while (uVar1 * 0x18 != lVar4);
    memcpy((TPZGeoElSide *)(puVar3 + 1),__src,__n);
    operator_delete__(&__src[-1].fSide,*(long *)&__src[-1].fSide * 0x18 + 8);
    this->fStore = (TPZGeoElSide *)(puVar3 + 1);
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}